

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractmodelserialiser.cpp
# Opt level: O2

void AbstractModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 uVar1;
  QArrayDataPointer<int> *this;
  undefined1 uVar2;
  Version VVar3;
  QArrayDataPointer<int> *other;
  Data *pDVar4;
  code *UNRECOVERED_JUMPTABLE;
  Version *pVVar5;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      setStreamVersion((AbstractModelSerialiser *)_o,*_a[1]);
      return;
    case 1:
      uVar1 = *_a[1];
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x70);
      goto LAB_0011d1bd;
    case 2:
      uVar1 = *_a[1];
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x78);
LAB_0011d1bd:
      (*UNRECOVERED_JUMPTABLE)(_o,uVar1);
      return;
    case 3:
      (**(code **)(*(long *)_o + 0x80))();
      return;
    case 4:
      VVar3 = streamVersion((AbstractModelSerialiser *)_o);
      pVVar5 = (Version *)*_a;
      if (pVVar5 == (Version *)0x0) {
        return;
      }
      goto LAB_0011d136;
    case 5:
      uVar2 = (**(code **)(*(long *)_o + 0xa0))(_o,*_a[1]);
      break;
    case 6:
      uVar2 = (**(code **)(*(long *)_o + 0xa8))(_o,*_a[1]);
      break;
    case 7:
      uVar2 = (**(code **)(*(long *)_o + 0xb0))(_o,*_a[1]);
      break;
    case 8:
      uVar2 = (**(code **)(*(long *)_o + 0xb8))(_o,_a[1]);
      break;
    default:
      goto switchD_0011d099_caseD_4;
    }
    if ((undefined1 *)*_a != (undefined1 *)0x0) {
      *(undefined1 *)*_a = uVar2;
    }
    break;
  case ReadProperty:
    this = (QArrayDataPointer<int> *)*_a;
    if (_id == 2) {
      pDVar4 = (Data *)(**(code **)(*(long *)_o + 0x98))();
    }
    else {
      if (_id != 1) {
        if (_id != 0) {
          return;
        }
        other = (QArrayDataPointer<int> *)(**(code **)(*(long *)_o + 0x60))();
        QArrayDataPointer<int>::operator=(this,other);
        return;
      }
      pDVar4 = (Data *)(**(code **)(*(long *)_o + 0x90))();
    }
    this->d = pDVar4;
    break;
  case WriteProperty:
    if (_id == 2) {
      setModel((AbstractModelSerialiser *)_o,**_a);
      return;
    }
    if (_id == 1) {
      setModel((AbstractModelSerialiser *)_o,**_a);
      return;
    }
    if (_id == 0) {
      (**(code **)(*(long *)_o + 0x68))();
      return;
    }
    break;
  case ResetProperty:
    if (_id == 0) {
      (**(code **)(*(long *)_o + 0x88))();
      return;
    }
    break;
  case RegisterPropertyMetaType:
    if (_id == 0) {
      VVar3 = qMetaTypeId<QList<int>>();
    }
    else {
      if (_id != 1) {
        *(undefined4 *)*_a = 0xffffffff;
        return;
      }
      VVar3 = qMetaTypeId<QAbstractItemModel*>();
    }
    pVVar5 = (Version *)*_a;
LAB_0011d136:
    *pVVar5 = VVar3;
  }
switchD_0011d099_caseD_4:
  return;
}

Assistant:

void AbstractModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AbstractModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->setStreamVersion((*reinterpret_cast< std::add_pointer_t<QDataStream::Version>>(_a[1]))); break;
        case 1: _t->addRoleToSave((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->removeRoleToSave((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->clearRoleToSave(); break;
        case 4: { QDataStream::Version _r = _t->streamVersion();
            if (_a[0]) *reinterpret_cast< QDataStream::Version*>(_a[0]) = std::move(_r); }  break;
        case 5: { bool _r = _t->saveModel((*reinterpret_cast< std::add_pointer_t<QIODevice*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 6: { bool _r = _t->saveModel((*reinterpret_cast< std::add_pointer_t<QByteArray*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 7: { bool _r = _t->loadModel((*reinterpret_cast< std::add_pointer_t<QIODevice*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 8: { bool _r = _t->loadModel((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 1:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractItemModel* >(); break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QList<int> >(); break;
        }
    }

#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<AbstractModelSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QList<int>*>(_v) = _t->rolesToSave(); break;
        case 1: *reinterpret_cast< QAbstractItemModel**>(_v) = _t->model(); break;
        case 2: *reinterpret_cast< const QAbstractItemModel**>(_v) = _t->constModel(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<AbstractModelSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRoleToSave(*reinterpret_cast< QList<int>*>(_v)); break;
        case 1: _t->setModel(*reinterpret_cast< QAbstractItemModel**>(_v)); break;
        case 2: _t->setModel(*reinterpret_cast< const QAbstractItemModel**>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<AbstractModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->resetRoleToSave(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}